

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

void __thiscall rcg::Stream::attachBuffers(Stream *this,bool enable)

{
  void *pvVar1;
  undefined7 in_register_00000031;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<GenApi_3_4::CNodeMapRef> rnodemap;
  shared_ptr<GenApi_3_4::CNodeMapRef> local_68;
  string local_50;
  __shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    local_68.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)&stack0xffffffffffffffe0);
    Buffer::setNodemap(&this->buffer,&local_68,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = &local_68.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  }
  else {
    pvVar1 = Device::getHandle((this->parent).
                               super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (pvVar1 == (void *)0x0) {
      return;
    }
    Device::getRemoteNodeMap
              ((Device *)&stack0xffffffffffffffe0,
               (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffe0);
    Device::getTLType_abi_cxx11_
              (&local_50,
               (this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Buffer::setNodemap(&this->buffer,(shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return;
}

Assistant:

void Stream::attachBuffers(bool enable)
{
  if (enable)
  {
    if (parent->getHandle() != 0)
    {
      std::shared_ptr<GenApi::CNodeMapRef> rnodemap=parent->getRemoteNodeMap();
      buffer.setNodemap(rnodemap, parent->getTLType());
    }
  }
  else
  {
    buffer.setNodemap(0, "");
  }
}